

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O1

void __thiscall
psy::C::Parser::parseTrivialSpecifier_AtFirst<psy::C::FunctionSpecifierSyntax>
          (Parser *this,SpecifierSyntax **spec,SyntaxKind specK)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  SyntaxToken *pSVar5;
  FunctionSpecifierSyntax *pFVar6;
  IndexType IVar7;
  ostream *poVar8;
  ulong uVar9;
  SyntaxKind local_16a;
  SyntaxToken local_168;
  SyntaxToken local_128;
  SyntaxToken local_e8;
  SyntaxToken local_a8;
  SyntaxToken local_68;
  
  local_16a = specK;
  pSVar5 = peek(this,1);
  local_68.tree_ = pSVar5->tree_;
  local_68.syntaxK_ = pSVar5->syntaxK_;
  local_68.byteSize_ = pSVar5->byteSize_;
  local_68.charSize_ = pSVar5->charSize_;
  local_68._14_2_ = *(undefined2 *)&pSVar5->field_0xe;
  local_68.byteOffset_ = pSVar5->byteOffset_;
  local_68.charOffset_ = pSVar5->charOffset_;
  local_68.matchingBracket_ = pSVar5->matchingBracket_;
  local_68.field_7 = pSVar5->field_7;
  local_68._34_2_ = *(undefined2 *)&pSVar5->field_0x22;
  local_68.lineno_ = pSVar5->lineno_;
  local_68.column_ = pSVar5->column_;
  local_68._44_4_ = *(undefined4 *)&pSVar5->field_0x2c;
  local_68.field_10 = pSVar5->field_10;
  bVar3 = SyntaxFacts::isStorageClassSyntax(&local_68);
  uVar9 = 1;
  if (!bVar3) {
    pSVar5 = peek(this,1);
    local_a8.field_10 = pSVar5->field_10;
    local_a8.tree_ = pSVar5->tree_;
    local_a8.syntaxK_ = pSVar5->syntaxK_;
    local_a8.byteSize_ = pSVar5->byteSize_;
    local_a8.charSize_ = pSVar5->charSize_;
    local_a8._14_2_ = *(undefined2 *)&pSVar5->field_0xe;
    local_a8.byteOffset_ = pSVar5->byteOffset_;
    local_a8.charOffset_ = pSVar5->charOffset_;
    local_a8.matchingBracket_ = pSVar5->matchingBracket_;
    local_a8.field_7 = pSVar5->field_7;
    local_a8._34_2_ = *(undefined2 *)&pSVar5->field_0x22;
    local_a8.lineno_ = pSVar5->lineno_;
    local_a8.column_ = pSVar5->column_;
    local_a8._44_4_ = *(undefined4 *)&pSVar5->field_0x2c;
    bVar4 = SyntaxFacts::isBasicTypeSpecifierSyntax(&local_a8);
    if (!bVar4) {
      pSVar5 = peek(this,1);
      local_128.tree_ = pSVar5->tree_;
      local_128.syntaxK_ = pSVar5->syntaxK_;
      local_128.byteSize_ = pSVar5->byteSize_;
      local_128.charSize_ = pSVar5->charSize_;
      local_128._14_2_ = *(undefined2 *)&pSVar5->field_0xe;
      local_128.byteOffset_ = pSVar5->byteOffset_;
      local_128.charOffset_ = pSVar5->charOffset_;
      local_128.matchingBracket_ = pSVar5->matchingBracket_;
      local_128.field_7 = pSVar5->field_7;
      local_128._34_2_ = *(undefined2 *)&pSVar5->field_0x22;
      local_128.lineno_ = pSVar5->lineno_;
      local_128.column_ = pSVar5->column_;
      local_128._44_4_ = *(undefined4 *)&pSVar5->field_0x2c;
      local_128.field_10 = pSVar5->field_10;
      bVar2 = true;
      bVar4 = false;
      if ((0x3a < local_128.syntaxK_ - 0x32) ||
         (bVar1 = false,
         (0x400000000000801U >> ((ulong)(local_128.syntaxK_ - 0x32) & 0x3f) & 1) == 0)) {
        bVar1 = false;
        uVar9 = 1;
        if (local_128.syntaxK_ == KeywordAlias___const) goto LAB_002c4926;
        pSVar5 = peek(this,1);
        local_168.tree_ = pSVar5->tree_;
        local_168.syntaxK_ = pSVar5->syntaxK_;
        local_168.byteSize_ = pSVar5->byteSize_;
        local_168.charSize_ = pSVar5->charSize_;
        local_168._14_2_ = *(undefined2 *)&pSVar5->field_0xe;
        local_168.byteOffset_ = pSVar5->byteOffset_;
        local_168.charOffset_ = pSVar5->charOffset_;
        local_168.matchingBracket_ = pSVar5->matchingBracket_;
        local_168.field_7 = pSVar5->field_7;
        local_168._34_2_ = *(undefined2 *)&pSVar5->field_0x22;
        local_168.lineno_ = pSVar5->lineno_;
        local_168.column_ = pSVar5->column_;
        local_168._44_4_ = *(undefined4 *)&pSVar5->field_0x2c;
        local_168.field_10 = pSVar5->field_10;
        if ((local_168._8_4_ - 0x2e & 0xffbf) != 0) {
          pSVar5 = peek(this,1);
          local_e8.tree_ = pSVar5->tree_;
          local_e8.syntaxK_ = pSVar5->syntaxK_;
          local_e8.byteSize_ = pSVar5->byteSize_;
          local_e8.charSize_ = pSVar5->charSize_;
          local_e8._14_2_ = *(undefined2 *)&pSVar5->field_0xe;
          local_e8.byteOffset_ = pSVar5->byteOffset_;
          local_e8.charOffset_ = pSVar5->charOffset_;
          local_e8.matchingBracket_ = pSVar5->matchingBracket_;
          local_e8.field_7 = pSVar5->field_7;
          local_e8._34_2_ = *(undefined2 *)&pSVar5->field_0x22;
          local_e8.lineno_ = pSVar5->lineno_;
          local_e8.column_ = pSVar5->column_;
          local_e8._44_4_ = *(undefined4 *)&pSVar5->field_0x2c;
          local_e8.field_10 = pSVar5->field_10;
          bVar2 = true;
          if (local_e8.syntaxK_ < Keyword_while) {
            uVar9 = 0x2000500000000000 >> ((byte)local_e8.syntaxK_ & 0x3f);
          }
          else {
            uVar9 = 0;
          }
          bVar4 = true;
          bVar1 = true;
          goto LAB_002c4926;
        }
        bVar1 = true;
      }
      bVar4 = bVar1;
      bVar1 = false;
      bVar2 = true;
      uVar9 = 1;
      goto LAB_002c4926;
    }
  }
  bVar2 = false;
  bVar4 = false;
  bVar1 = false;
LAB_002c4926:
  if (bVar1) {
    SyntaxToken::~SyntaxToken(&local_e8);
  }
  if (bVar4) {
    SyntaxToken::~SyntaxToken(&local_168);
  }
  if (bVar2) {
    SyntaxToken::~SyntaxToken(&local_128);
  }
  if (!bVar3) {
    SyntaxToken::~SyntaxToken(&local_a8);
  }
  SyntaxToken::~SyntaxToken(&local_68);
  if ((uVar9 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
               ,100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x56f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "assert failure: <storage-class-specifier>, (builtin) <type-specifier>, <function-specifier>, <type-qualifier>, or<GNU-ext-asm-qualifier>"
               ,0x88);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  else {
    pFVar6 = makeNode<psy::C::FunctionSpecifierSyntax,psy::C::SyntaxKind&>(this,&local_16a);
    *spec = (SpecifierSyntax *)pFVar6;
    IVar7 = consume(this);
    (pFVar6->super_TrivialSpecifierSyntax).specTkIdx_ = IVar7;
  }
  return;
}

Assistant:

void Parser::parseTrivialSpecifier_AtFirst(SpecifierSyntax*& spec, SyntaxKind specK)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(SyntaxFacts::isStorageClassSyntax(peek())
                        || SyntaxFacts::isBasicTypeSpecifierSyntax(peek())
                        || SyntaxFacts::isTypeQualifierSyntax(peek())
                        || SyntaxFacts::isFunctionSpecifierSyntax(peek())
                        || SyntaxFacts::isExtGNU_AsmQualifierSyntax(peek()),
                  return,
                  "assert failure: <storage-class-specifier>, "
                                  "(builtin) <type-specifier>, "
                                  "<function-specifier>, "
                                  "<type-qualifier>, or"
                                  "<GNU-ext-asm-qualifier>");

    auto trivSpec = makeNode<SpecT>(specK);
    spec = trivSpec;
    trivSpec->specTkIdx_ = consume();
}